

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeAddrMode6Operand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  DecodeStatus In;
  uint64_t in_RCX;
  undefined8 in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint align;
  uint Rm;
  DecodeStatus S;
  uint RegNo;
  undefined4 in_stack_ffffffffffffffe8;
  DecodeStatus local_4;
  
  RegNo = (uint)((ulong)in_RDX >> 0x20);
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0,4);
  uVar3 = fieldFromInstruction_4(in_ESI,4,2);
  In = DecodeGPRRegisterClass
                 ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),RegNo,in_RCX,
                  (void *)CONCAT44(local_4,uVar2));
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,In);
  if (_Var1) {
    if (uVar3 == 0) {
      MCOperand_CreateImm0(in_RDI,0);
    }
    else {
      MCOperand_CreateImm0(in_RDI,(long)(4 << ((byte)uVar3 & 0x1f)));
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeAddrMode6Operand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rm = fieldFromInstruction_4(Val, 0, 4);
	unsigned align = fieldFromInstruction_4(Val, 4, 2);

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!align)
		MCOperand_CreateImm0(Inst, 0);
	else
		MCOperand_CreateImm0(Inst, 4 << align);

	return S;
}